

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::AddVariantChildrenToPrimNode
          (Impl *this,int32_t prim_idx,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  bool bVar5;
  ostringstream ss_w;
  string local_1c0;
  key_type_conflict1 local_1a0 [28];
  ios_base local_130 [264];
  
  if (-1 < prim_idx) {
    p_Var2 = (this->_variantChildren)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var2 != (_Base_ptr)0x0) {
      p_Var1 = &(this->_variantChildren)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = &p_Var1->_M_header;
      do {
        bVar5 = p_Var2[1]._M_color < (uint)prim_idx;
        if (!bVar5) {
          p_Var4 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[bVar5];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var4[1]._M_color <= (uint)prim_idx)) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"AddVariantChildrenToPrimNode",0x1c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a0,0x17f);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Multiple Field with VariantSet SpecType detected.",0x31);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushWarn(this,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        ::std::ios_base::~ios_base(local_130);
      }
    }
    local_1a0[0] = prim_idx;
    this_00 = ::std::
              map<unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
              ::operator[](&this->_variantChildren,local_1a0);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)this_00,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)variantChildren);
  }
  return -1 < prim_idx;
}

Assistant:

bool AddVariantChildrenToPrimNode(
      int32_t prim_idx, const std::vector<value::token> &variantChildren) {
    if (prim_idx < 0) {
      return false;
    }

    if (_variantChildren.count(uint32_t(prim_idx))) {
      PUSH_WARN("Multiple Field with VariantSet SpecType detected.");
    }

    _variantChildren[uint32_t(prim_idx)] = variantChildren;

    return true;
  }